

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

int Bac_ManAssignInternTwo(Bac_Ntk_t *p,int iNum,int nDigits,char *pPref,Vec_Int_t *vMap)

{
  uint uVar1;
  uint uVar2;
  char Buffer [16];
  char local_48 [24];
  
  uVar2 = 0;
  uVar1 = 0;
  do {
    if (uVar1 != 0) {
      if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vMap->pArray[uVar1] == 0) {
        vMap->pArray[uVar1] = 1;
        return uVar1;
      }
    }
    if (uVar2 == 0) {
      sprintf(local_48,"%s%0*d",pPref,(ulong)(uint)nDigits,(ulong)(uint)iNum);
    }
    else {
      sprintf(local_48,"%s%0*d_%d",pPref,(ulong)(uint)nDigits,(ulong)(uint)iNum,(ulong)uVar2);
    }
    uVar1 = Abc_NamStrFindOrAdd(p->pDesign->pStrs,local_48,(int *)0x0);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int Bac_ManAssignInternTwo( Bac_Ntk_t * p, int iNum, int nDigits, char * pPref, Vec_Int_t * vMap )
{
    char Buffer[16]; int i, NameId = 0;
    for ( i = 0; !NameId || Vec_IntEntry(vMap, NameId); i++ )
    {
        if ( i == 0 )
            sprintf( Buffer, "%s%0*d", pPref, nDigits, iNum );
        else
            sprintf( Buffer, "%s%0*d_%d", pPref, nDigits, iNum, i );
        NameId = Abc_NamStrFindOrAdd( p->pDesign->pStrs, Buffer, NULL );
    }
    Vec_IntWriteEntry( vMap, NameId, 1 );
    return NameId;
}